

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexagons.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  VideoCapture capture;
  Mat dstImage;
  Mat frame;
  Mat imageHexagons;
  _InputArray local_228;
  undefined8 uStack_210;
  _InputArray local_208;
  undefined8 local_1f0;
  VideoCapture local_1e8 [48];
  undefined8 local_1b8;
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  local_1b8 = 0x384000005a0;
  cv::Mat::Mat(local_f0,&local_1b8,0x10);
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    cv::Mat::Mat(local_1b0);
    cv::Mat::Mat(local_150);
    cv::VideoCapture::VideoCapture(local_1e8);
    cv::VideoCapture::set((int)local_1e8,1440.0);
    cv::VideoCapture::set((int)local_1e8,900.0);
    cv::VideoCapture::open((int)local_1e8,0);
    cVar1 = cv::VideoCapture::isOpened();
    if (cVar1 == '\0') {
      iVar2 = -1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR! Unable to open camera\n",0x1d);
    }
    else {
      do {
        cv::VideoCapture::operator>>(local_1e8,local_150);
        cVar1 = cv::Mat::empty();
        if (cVar1 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR! blank frame grabbed\n",0x1b);
          break;
        }
        local_228.sz.width = 0;
        local_228.sz.height = 0;
        uStack_210 = 0;
        local_228._0_8_ = (Size *)0x0;
        local_228.obj = (void *)0x0;
        cv::Mat::operator=(local_f0,(Scalar_ *)&local_228);
        local_228.sz.width = 0;
        local_228.sz.height = 0;
        uStack_210 = 0;
        local_228._0_8_ = (Size *)0x0;
        local_228.obj = (void *)0x0;
        cv::Mat::operator=(local_1b0,(Scalar_ *)&local_228);
        cv::Mat::Mat(local_90,local_f0);
        drawHexagons(local_90,0xb);
        cv::Mat::~Mat(local_90);
        local_228.sz.width = 0;
        local_228.sz.height = 0;
        local_228.flags = 0x1010000;
        local_208.sz.width = 0;
        local_208.sz.height = 0;
        local_208.flags = 0x2010000;
        local_1f0 = 0x384000005a0;
        local_228.obj = local_150;
        local_208.obj = local_150;
        cv::resize(0,0,&local_228,&local_208,&local_1f0,2);
        local_228.sz.width = 0;
        local_228.sz.height = 0;
        local_228.flags = 0x2010000;
        local_228.obj = local_1b0;
        local_208.sz.width = 0;
        local_208.sz.height = 0;
        local_208.flags = 0x1010000;
        local_208.obj = local_f0;
        cv::Mat::copyTo((_OutputArray *)local_150,&local_228);
        local_228._0_8_ = &local_228.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Masked","");
        local_208.sz.width = 0;
        local_208.sz.height = 0;
        local_208.flags = 0x1010000;
        local_208.obj = local_1b0;
        cv::imshow((string *)&local_228,&local_208);
        if ((Size *)local_228._0_8_ != &local_228.sz) {
          operator_delete((void *)local_228._0_8_,(long)local_228.sz + 1);
        }
        iVar2 = cv::waitKey(5);
      } while (iVar2 < 0);
      iVar2 = 0;
    }
    cv::VideoCapture::~VideoCapture(local_1e8);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat(local_1b0);
  }
  else {
    iVar2 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR! Image cannot be created\n",0x1f);
  }
  cv::Mat::~Mat(local_f0);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
  Size imageSize(w, h);
  Mat imageHexagons(imageSize, CV_8UC3);

  if (imageHexagons.empty())
  {
    cerr << "ERROR! Image cannot be created\n";
    return -1;
  }

  Mat dstImage, frame;
  VideoCapture capture;
  int factorDefault = 11; // increase/decrease space between hexagons
  int deviceID = 0; // specify your video capture device
  int apiID = cv::CAP_ANY;

  capture.set(VideoCaptureProperties::CAP_PROP_FRAME_WIDTH, w);
  capture.set(VideoCaptureProperties::CAP_PROP_FRAME_HEIGHT, h);

  capture.open(deviceID, apiID);

  if (!capture.isOpened()) {
    cerr << "ERROR! Unable to open camera\n";
    return -1;
  }

  for (;;) {
    capture >> frame;

    if (frame.empty()) {
      cerr << "ERROR! blank frame grabbed\n";
      break;
    }

    imageHexagons = Scalar(0, 0, 0);
    dstImage = Scalar(0, 0, 0);

    drawHexagons(imageHexagons, factorDefault);
    resize(frame, frame, Size(w, h), 0, 0, INTER_CUBIC);
    frame.copyTo(dstImage, imageHexagons);
    imshow("Masked", dstImage);

    if (waitKey(5) >= 0)
      break;
  }

  return 0;
}